

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void handle_left(sockaddr_in addr_from)

{
  uint uVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  undefined8 uVar4;
  ulong __n;
  Ip_Port ip_port;
  int id;
  sockaddr_in addr;
  char str_addr [1000];
  
  uVar1 = *(uint *)((long)buf + 8);
  __n = (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18);
  strncpy(str_addr,(char *)((long)buf + 0xc),__n);
  uVar4 = addr_from._0_8_;
  if (str_addr[0] != '0') {
    str_addr[__n] = '\0';
    parse_address(str_addr,&addr);
    uVar4 = addr._0_8_;
  }
  ip_port.first = SUB84(uVar4,4);
  ip_port.second = SUB82(uVar4,2);
  sVar2 = std::
          map<std::pair<unsigned_int,_unsigned_short>,_int,_std::less<std::pair<unsigned_int,_unsigned_short>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>_>_>
          ::count(&idconnections,&ip_port);
  if (sVar2 == 0) {
    fwrite("Already left\n",0xd,1,_stderr);
  }
  else {
    pmVar3 = std::
             map<std::pair<unsigned_int,_unsigned_short>,_int,_std::less<std::pair<unsigned_int,_unsigned_short>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>_>_>
             ::operator[](&idconnections,&ip_port);
    id = *pmVar3;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
              (&children._M_t,&id);
  }
  return;
}

Assistant:

void handle_left(struct sockaddr_in addr_from) {
    size_t size_addr = ntohl(((uint32_t*)buf)[2]);
    char str_addr[ADDRESS_MAX_SIZE];
    strncpy(str_addr, (char*)buf + 3 * sizeof(int), size_addr);

    struct sockaddr_in addr;
    if (str_addr[0] == '0') {
        addr = addr_from;
    }
    else {
        str_addr[size_addr] = '\0';
        parse_address(str_addr, addr);
    }

    Ip_Port ip_port = get_ip_port(addr);
    if (idconnections.count(ip_port)) {
        int id = idconnections[ip_port];
        children.erase(id);
    }
    else {
        fprintf(stderr, "Already left\n");
    }
}